

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLFWwindow *pGVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  float *pfVar8;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 auStack_58 [5];
  
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    uVar5 = 0;
    glfwWindowHint(0x20005,0);
    glfwWindowHint(0x20004,0);
    piVar7 = &titles_rel;
    pfVar8 = &colors[0].b;
    while( true ) {
      pGVar4 = glfwCreateWindow(200,200,(char *)((long)&titles_rel + (long)*piVar7),
                                (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      auStack_58[uVar5] = pGVar4;
      if (pGVar4 == (GLFWwindow *)0x0) break;
      glfwSetKeyCallback(pGVar4,key_callback);
      glfwMakeContextCurrent(pGVar4);
      glClearColor(((anon_struct_12_3_4e92c811 *)(pfVar8 + -2))->r,pfVar8[-1],*pfVar8,0x3f800000);
      glfwGetWindowFrameSize(pGVar4,&local_5c,&local_60,&local_64,&local_68);
      iVar3 = local_5c + local_64 + 300;
      if ((uVar5 & 1) == 0) {
        iVar3 = 100;
      }
      glfwSetWindowPos(pGVar4,iVar3,
                       (local_68 + local_60 + 200) * ((uint)(uVar5 >> 1) & 0x7fffffff) + 100);
      uVar5 = uVar5 + 1;
      piVar7 = piVar7 + 1;
      pfVar8 = pfVar8 + 3;
      if (uVar5 == 4) {
        lVar6 = 0;
        do {
          glfwShowWindow((GLFWwindow *)auStack_58[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        lVar6 = 0;
        bVar2 = true;
        do {
          do {
            bVar1 = bVar2;
            pGVar4 = (GLFWwindow *)auStack_58[lVar6];
            glfwMakeContextCurrent(pGVar4);
            glClear(0x4000);
            glfwSwapBuffers(pGVar4);
            iVar3 = glfwWindowShouldClose(pGVar4);
            if (iVar3 != 0) {
              bVar1 = false;
            }
            lVar6 = lVar6 + 1;
            bVar2 = bVar1;
          } while (lVar6 != 4);
          glfwPollEvents();
          lVar6 = 0;
          bVar2 = true;
        } while (bVar1);
        glfwTerminate();
        exit(0);
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    GLboolean running = GL_TRUE;
    GLFWwindow* windows[4];

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_DECORATED, GL_FALSE);
    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        glClearColor(colors[i].r, colors[i].g, colors[i].b, 1.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GL_FALSE;
        }

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}